

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

bool __thiscall
wallet::LegacyScriptPubKeyMan::AddKeyPubKeyWithDB
          (LegacyScriptPubKeyMan *this,WalletBatch *batch,CKey *secret,CPubKey *pubkey)

{
  byte bVar1;
  undefined1 uVar2;
  bool bVar3;
  byte bVar4;
  ulong uVar5;
  mapped_type *this_00;
  CPubKey *in_RCX;
  CPubKey *in_RDX;
  WalletBatch *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  bool needsDB;
  CScript script;
  undefined4 in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  undefined6 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe56;
  undefined1 in_stack_fffffffffffffe57;
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  *in_stack_fffffffffffffe58;
  PKHash *in_stack_fffffffffffffe60;
  CScript *in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  LegacyScriptPubKeyMan *this_01;
  undefined7 in_stack_fffffffffffffea8;
  undefined7 in_stack_fffffffffffffed0;
  CPubKey *vchPrivKey;
  WalletBatch *this_02;
  bool local_101;
  signal_base local_8;
  
  local_8._vptr_signal_base = *(_func_int ***)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_fffffffffffffe58,
             (char *)CONCAT17(in_stack_fffffffffffffe57,
                              CONCAT16(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50)),
             in_stack_fffffffffffffe4c,(AnnotatedMixin<std::recursive_mutex> *)0x166ce39);
  bVar1 = (**(code **)(*(long *)in_RDI[1] + 0x20))((long *)in_RDI[1],0x100000000);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("!m_storage.IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,0x2e6,
                  "bool wallet::LegacyScriptPubKeyMan::AddKeyPubKeyWithDB(WalletBatch &, const CKey &, const CPubKey &)"
                 );
  }
  bVar1 = (in_RDI[0x65] != 0 ^ 0xffU) & 1;
  if (bVar1 != 0) {
    in_RDI[0x65] = (long)in_RSI;
  }
  uVar5 = (**(code **)(*in_RDI + 0xe0))(in_RDI,in_RDX,in_RCX);
  if ((uVar5 & 1) == 0) {
    if ((bVar1 & 1) != 0) {
      in_RDI[0x65] = 0;
    }
    local_101 = false;
  }
  else {
    if ((bVar1 & 1) != 0) {
      in_RDI[0x65] = 0;
    }
    CScript::CScript((CScript *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    PKHash::PKHash(in_stack_fffffffffffffe60,(CPubKey *)in_stack_fffffffffffffe58);
    std::
    variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
    ::variant<PKHash,void,void,PKHash,void>
              (in_stack_fffffffffffffe58,
               (PKHash *)
               CONCAT17(in_stack_fffffffffffffe57,
                        CONCAT16(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50)));
    GetScriptForDestination
              ((CTxDestination *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    this_01 = (LegacyScriptPubKeyMan *)&stack0xffffffffffffffb8;
    CScript::operator=((CScript *)in_stack_fffffffffffffe58,
                       (CScript *)
                       CONCAT17(in_stack_fffffffffffffe57,
                                CONCAT16(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50)));
    CScript::~CScript((CScript *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    std::
    variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    uVar2 = LegacyDataSPKM::HaveWatchOnly
                      ((LegacyDataSPKM *)
                       CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                       in_stack_fffffffffffffe70);
    if ((bool)uVar2) {
      RemoveWatchOnly(this_01,(CScript *)
                              CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
    }
    GetScriptForRawPubKey((CPubKey *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
    CScript::operator=((CScript *)in_stack_fffffffffffffe58,
                       (CScript *)
                       CONCAT17(in_stack_fffffffffffffe57,
                                CONCAT16(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50)));
    CScript::~CScript((CScript *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    bVar3 = LegacyDataSPKM::HaveWatchOnly
                      ((LegacyDataSPKM *)
                       CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                       in_stack_fffffffffffffe70);
    if (bVar3) {
      RemoveWatchOnly(this_01,(CScript *)CONCAT17(bVar3,in_stack_fffffffffffffe90));
    }
    (**(code **)(*(long *)in_RDI[1] + 0x28))((long *)in_RDI[1],in_RSI);
    bVar4 = (**(code **)(*(long *)in_RDI[1] + 0x48))();
    if ((bVar4 & 1) == 0) {
      vchPrivKey = in_RCX;
      this_02 = in_RSI;
      CKey::GetPrivKey((CKey *)CONCAT17(uVar2,in_stack_fffffffffffffea8));
      CPubKey::GetID(in_RCX);
      this_00 = std::
                map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
                ::operator[]((map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
                              *)in_RCX,(key_type *)in_RSI);
      local_101 = WalletBatch::WriteKey
                            (this_02,in_RDX,(CPrivKey *)vchPrivKey,
                             (CKeyMetadata *)CONCAT17(bVar1,in_stack_fffffffffffffed0));
      std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)this_00);
    }
    else {
      local_101 = true;
    }
    CScript::~CScript((CScript *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  }
  if (*(_func_int ***)(in_FS_OFFSET + 0x28) != local_8._vptr_signal_base) {
    __stack_chk_fail();
  }
  return local_101;
}

Assistant:

bool LegacyScriptPubKeyMan::AddKeyPubKeyWithDB(WalletBatch& batch, const CKey& secret, const CPubKey& pubkey)
{
    AssertLockHeld(cs_KeyStore);

    // Make sure we aren't adding private keys to private key disabled wallets
    assert(!m_storage.IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS));

    // FillableSigningProvider has no concept of wallet databases, but calls AddCryptedKey
    // which is overridden below.  To avoid flushes, the database handle is
    // tunneled through to it.
    bool needsDB = !encrypted_batch;
    if (needsDB) {
        encrypted_batch = &batch;
    }
    if (!AddKeyPubKeyInner(secret, pubkey)) {
        if (needsDB) encrypted_batch = nullptr;
        return false;
    }
    if (needsDB) encrypted_batch = nullptr;

    // check if we need to remove from watch-only
    CScript script;
    script = GetScriptForDestination(PKHash(pubkey));
    if (HaveWatchOnly(script)) {
        RemoveWatchOnly(script);
    }
    script = GetScriptForRawPubKey(pubkey);
    if (HaveWatchOnly(script)) {
        RemoveWatchOnly(script);
    }

    m_storage.UnsetBlankWalletFlag(batch);
    if (!m_storage.HasEncryptionKeys()) {
        return batch.WriteKey(pubkey,
                                                 secret.GetPrivKey(),
                                                 mapKeyMetadata[pubkey.GetID()]);
    }
    return true;
}